

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_noframe.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *format;
  int cy;
  int cx;
  ALLEGRO_EVENT event;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  undefined8 local_80;
  int local_78 [8];
  int local_58;
  int local_54;
  int local_38;
  
  cVar3 = al_install_system(0x5020700,atexit);
  if (cVar3 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_install_mouse();
    al_install_keyboard();
    al_init_image_addon();
    al_set_new_display_flags(0x20);
    lVar5 = al_create_display(300,200);
    if (lVar5 == 0) {
      format = "Error creating display\n";
    }
    else {
      lVar6 = al_load_bitmap("data/fakeamp.bmp");
      if (lVar6 != 0) {
        uVar7 = al_create_timer(0x3fa1111120000000);
        uVar8 = al_create_event_queue();
        uVar9 = al_get_mouse_event_source();
        al_register_event_source(uVar8,uVar9);
        uVar9 = al_get_keyboard_event_source();
        al_register_event_source(uVar8,uVar9);
        uVar9 = al_get_display_event_source(lVar5);
        al_register_event_source(uVar8,uVar9);
        uVar9 = al_get_timer_event_source(uVar7);
        al_register_event_source(uVar8,uVar9);
        local_80 = uVar7;
        al_start_timer(uVar7);
        local_8c = 0;
        local_90 = 0;
        bVar2 = false;
        while( true ) {
          while( true ) {
            while (bVar1 = bVar2, al_wait_for_event(uVar8,local_78), local_78[0] < 0x16) {
              if (local_78[0] == 0x14) {
                bVar2 = false;
                if (bVar1) {
                  cVar3 = al_get_mouse_cursor_position(&local_84,&local_88);
                  if (cVar3 != '\0') {
                    al_set_window_position(lVar5,local_84 - local_8c,local_88 - local_90);
                  }
                  bVar2 = true;
                }
              }
              else {
                if (local_78[0] != 0x15) goto LAB_0010254b;
                if (local_58 != 0 && local_38 == 1) {
                  local_90 = local_54;
                  local_8c = local_58;
                }
                bVar2 = (bool)((local_58 != 0 && local_38 == 1) | bVar1);
                if (local_38 == 2) {
                  uVar10 = al_get_display_flags(lVar5);
                  al_set_display_flag(lVar5,0x20,(uVar10 & 0x20) == 0);
                }
              }
            }
            if (local_78[0] != 0x16) break;
            bVar2 = (bool)(local_38 != 1 & bVar1);
          }
          if (local_78[0] == 0x2a) break;
LAB_0010254b:
          if ((local_78[0] == 10) && (local_58 == 0x3b)) break;
          bVar2 = bVar1;
          if (local_78[0] == 0x1e) {
            al_draw_bitmap(0,0,lVar6,0);
            al_flip_display();
          }
        }
        al_destroy_timer(local_80);
        al_destroy_event_queue(uVar8);
        al_destroy_display(lVar5);
        return 0;
      }
      format = "Error loading fakeamp.bmp\n";
    }
  }
  abort_example(format);
  iVar4 = __cxa_atexit();
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bitmap;
   ALLEGRO_EVENT_QUEUE *events;
   ALLEGRO_EVENT event;
   bool down = false;
   int down_x = 0, down_y = 0;
   ALLEGRO_TIMER *timer;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_mouse();
   al_install_keyboard();
   al_init_image_addon();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_FRAMELESS);
   display = al_create_display(300, 200);
   if (!display) {
      abort_example("Error creating display\n");
   }
   
   bitmap = al_load_bitmap("data/fakeamp.bmp");
   if (!bitmap) {
      abort_example("Error loading fakeamp.bmp\n");
   }

   timer = al_create_timer(1.0f/30.0f);

   events = al_create_event_queue();
   al_register_event_source(events, al_get_mouse_event_source());
   al_register_event_source(events, al_get_keyboard_event_source());
   al_register_event_source(events, al_get_display_event_source(display));
   al_register_event_source(events, al_get_timer_event_source(timer));

   al_start_timer(timer);

   for (;;) {
      al_wait_for_event(events, &event);
      if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1 && event.mouse.x) {
            down = true;
            down_x = event.mouse.x;
            down_y = event.mouse.y;
         }
         if (event.mouse.button == 2) {
            al_set_display_flag(display, ALLEGRO_FRAMELESS,
               !(al_get_display_flags(display) & ALLEGRO_FRAMELESS));
         }
      }
      else if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_UP) {
         if (event.mouse.button == 1) {
            down = false;
         }
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_AXES) {
         if (down) {
            int cx, cy;
            if (al_get_mouse_cursor_position(&cx, &cy)) {
               al_set_window_position(display, cx - down_x, cy - down_y);
            }
         }
      }
      else if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
	    event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         al_draw_bitmap(bitmap, 0, 0, 0);
         al_flip_display();
      }
   }

   al_destroy_timer(timer);
   al_destroy_event_queue(events);
   al_destroy_display(display);

   return 0;
}